

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O3

void ncnn::copy_make_border_image<signed_char>(Mat *src,Mat *dst,int top,int left,int type,char v)

{
  undefined1 uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  void *__s;
  ulong uVar8;
  undefined1 *puVar9;
  long lVar10;
  ulong __n;
  undefined1 *puVar11;
  int iVar12;
  uint __c;
  uint uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar41;
  undefined1 auVar36 [16];
  int iVar42;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  int iVar103;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar104;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  int iVar105;
  int iVar117;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar118 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  int local_6c;
  
  __n = (ulong)(uint)left;
  uVar2 = dst->w;
  lVar10 = (long)(int)uVar2;
  iVar3 = dst->h;
  puVar11 = (undefined1 *)src->data;
  __s = dst->data;
  if (type == 0) {
    __c = (uint)(byte)v;
    iVar103 = top;
    if (top < 1) {
      iVar12 = 0;
    }
    else {
      do {
        if (0 < (int)uVar2) {
          memset(__s,__c,(ulong)uVar2);
        }
        __s = (void *)((long)__s + lVar10);
        iVar103 = iVar103 + -1;
        iVar12 = top;
      } while (iVar103 != 0);
    }
    if (iVar12 < src->h + top) {
      uVar8 = 0;
      if (0 < left) {
        uVar8 = __n;
      }
      do {
        uVar7 = 0;
        if (0 < left) {
          memset(__s,__c,__n);
          uVar7 = __n;
        }
        iVar103 = src->w;
        if ((long)iVar103 < 0xc) {
          uVar14 = uVar8;
          if ((int)uVar7 < iVar103 + left) {
            do {
              *(undefined1 *)((long)__s + uVar14) = puVar11[uVar14 - (long)left];
              uVar7 = uVar14 + 1;
              iVar103 = src->w;
              uVar14 = uVar7;
            } while ((long)uVar7 < (long)(iVar103 + left));
          }
        }
        else {
          memcpy((void *)((long)__s + (long)left),puVar11,(long)iVar103);
          iVar103 = src->w;
          uVar7 = (ulong)(uint)((int)uVar7 + iVar103);
        }
        uVar13 = (uint)uVar7;
        if ((int)uVar13 < (int)uVar2) {
          memset((void *)((long)(int)uVar13 + (long)__s),__c,(ulong)(~uVar13 + uVar2) + 1);
          iVar103 = src->w;
        }
        puVar11 = puVar11 + iVar103;
        __s = (void *)((long)__s + lVar10);
        iVar12 = iVar12 + 1;
      } while (iVar12 < src->h + top);
    }
    local_6c = iVar3 - iVar12;
    if (local_6c != 0 && iVar12 <= iVar3) {
      do {
        if (0 < (int)uVar2) {
          memset(__s,__c,(ulong)uVar2);
        }
        __s = (void *)((long)__s + lVar10);
        local_6c = local_6c + -1;
      } while (local_6c != 0);
    }
  }
  else if (type == 2) {
    uVar8 = (ulong)(uint)src->w;
    puVar11 = puVar11 + src->w * top;
    if (top < 1) {
      iVar103 = 0;
    }
    else {
      lVar6 = (long)left;
      iVar12 = 0;
      do {
        uVar7 = 0;
        if (0 < left) {
          puVar9 = puVar11 + lVar6;
          uVar8 = 0;
          do {
            *(undefined1 *)((long)__s + uVar8) = *puVar9;
            uVar8 = uVar8 + 1;
            puVar9 = puVar9 + -1;
          } while (__n != uVar8);
          uVar8 = (ulong)(uint)src->w;
          uVar7 = __n;
        }
        if ((int)uVar8 < 0xc) {
          if ((int)uVar7 < (int)uVar8 + left) {
            do {
              *(undefined1 *)((long)__s + uVar7) = puVar11[uVar7 - lVar6];
              uVar7 = uVar7 + 1;
              uVar8 = (ulong)(uint)src->w;
            } while ((long)uVar7 < (long)(src->w + left));
          }
        }
        else {
          memcpy((void *)((long)__s + lVar6),puVar11,uVar8);
          uVar8 = (ulong)(uint)src->w;
          uVar7 = (ulong)(uint)((int)uVar7 + src->w);
        }
        iVar103 = (int)uVar7;
        if (iVar103 < (int)uVar2) {
          lVar4 = (long)iVar103;
          iVar103 = (left + -2) - iVar103;
          do {
            *(undefined1 *)((long)__s + lVar4) = puVar11[iVar103 + src->w * 2];
            lVar4 = lVar4 + 1;
            iVar103 = iVar103 + -1;
          } while (lVar10 != lVar4);
          uVar8 = (ulong)(uint)src->w;
        }
        __s = (void *)((long)__s + lVar10);
        puVar11 = puVar11 + -(long)(int)uVar8;
        iVar12 = iVar12 + 1;
        iVar103 = top;
      } while (iVar12 != top);
    }
    if (iVar103 < src->h + top) {
      lVar6 = (long)left;
      do {
        uVar7 = 0;
        if (0 < left) {
          puVar9 = puVar11 + lVar6;
          uVar8 = 0;
          do {
            *(undefined1 *)((long)__s + uVar8) = *puVar9;
            uVar8 = uVar8 + 1;
            puVar9 = puVar9 + -1;
          } while (__n != uVar8);
          uVar8 = (ulong)(uint)src->w;
          uVar7 = __n;
        }
        if ((int)uVar8 < 0xc) {
          if ((int)uVar7 < (int)uVar8 + left) {
            do {
              *(undefined1 *)((long)__s + uVar7) = puVar11[uVar7 - lVar6];
              uVar7 = uVar7 + 1;
              uVar8 = (ulong)(uint)src->w;
            } while ((long)uVar7 < (long)(src->w + left));
          }
        }
        else {
          memcpy((void *)((long)__s + lVar6),puVar11,uVar8);
          uVar8 = (ulong)(uint)src->w;
          uVar7 = (ulong)(uint)((int)uVar7 + src->w);
        }
        iVar12 = (int)uVar7;
        if (iVar12 < (int)uVar2) {
          lVar4 = (long)iVar12;
          iVar12 = (left + -2) - iVar12;
          do {
            *(undefined1 *)((long)__s + lVar4) = puVar11[iVar12 + src->w * 2];
            lVar4 = lVar4 + 1;
            iVar12 = iVar12 + -1;
          } while (lVar10 != lVar4);
          uVar8 = (ulong)(uint)src->w;
        }
        puVar11 = puVar11 + (int)uVar8;
        __s = (void *)((long)__s + lVar10);
        iVar103 = iVar103 + 1;
      } while (iVar103 < src->h + top);
    }
    if (iVar103 < iVar3) {
      puVar11 = puVar11 + -(long)((int)uVar8 * 2);
      lVar6 = (long)left;
      do {
        uVar7 = 0;
        if (0 < left) {
          puVar9 = puVar11 + lVar6;
          uVar8 = 0;
          do {
            *(undefined1 *)((long)__s + uVar8) = *puVar9;
            uVar8 = uVar8 + 1;
            puVar9 = puVar9 + -1;
          } while (__n != uVar8);
          uVar8 = (ulong)(uint)src->w;
          uVar7 = __n;
        }
        if ((int)uVar8 < 0xc) {
          if ((int)uVar7 < (int)uVar8 + left) {
            do {
              *(undefined1 *)((long)__s + uVar7) = puVar11[uVar7 - lVar6];
              uVar7 = uVar7 + 1;
              uVar8 = (ulong)(uint)src->w;
            } while ((long)uVar7 < (long)(src->w + left));
          }
        }
        else {
          memcpy((void *)((long)__s + lVar6),puVar11,uVar8);
          uVar8 = (ulong)(uint)src->w;
          uVar7 = (ulong)(uint)((int)uVar7 + src->w);
        }
        iVar12 = (int)uVar7;
        if (iVar12 < (int)uVar2) {
          lVar4 = (long)iVar12;
          iVar12 = (left + -2) - iVar12;
          do {
            *(undefined1 *)((long)__s + lVar4) = puVar11[iVar12 + src->w * 2];
            lVar4 = lVar4 + 1;
            iVar12 = iVar12 + -1;
          } while (lVar10 != lVar4);
          uVar8 = (ulong)(uint)src->w;
        }
        __s = (void *)((long)__s + lVar10);
        puVar11 = puVar11 + -(long)(int)uVar8;
        iVar103 = iVar103 + 1;
      } while (iVar103 != iVar3);
    }
  }
  else if (type == 1) {
    lVar6 = (long)left;
    if (top < 1) {
      iVar103 = 0;
    }
    else {
      lVar4 = __n - 1;
      auVar38._8_4_ = (int)lVar4;
      auVar38._0_8_ = lVar4;
      auVar38._12_4_ = (int)((ulong)lVar4 >> 0x20);
      iVar12 = 0;
      auVar132 = _DAT_00172100;
      do {
        uVar8 = 0;
        if (0 < left) {
          uVar1 = *puVar11;
          uVar7 = 0;
          auVar54 = _DAT_00172270;
          auVar123 = _DAT_00172260;
          auVar88 = _DAT_001727b0;
          auVar21 = _DAT_001727a0;
          auVar24 = _DAT_00172790;
          auVar27 = _DAT_00172780;
          auVar30 = _DAT_00172770;
          auVar33 = _DAT_00172760;
          do {
            auVar36 = auVar38 ^ auVar132;
            auVar43 = auVar54 ^ auVar132;
            iVar103 = auVar36._0_4_;
            iVar105 = -(uint)(iVar103 < auVar43._0_4_);
            iVar104 = auVar36._4_4_;
            auVar44._4_4_ = -(uint)(iVar104 < auVar43._4_4_);
            iVar41 = auVar36._8_4_;
            iVar117 = -(uint)(iVar41 < auVar43._8_4_);
            iVar42 = auVar36._12_4_;
            auVar44._12_4_ = -(uint)(iVar42 < auVar43._12_4_);
            auVar79._4_4_ = iVar105;
            auVar79._0_4_ = iVar105;
            auVar79._8_4_ = iVar117;
            auVar79._12_4_ = iVar117;
            auVar118 = pshuflw(in_XMM12,auVar79,0xe8);
            auVar36._4_4_ = -(uint)(auVar43._4_4_ == iVar104);
            auVar36._12_4_ = -(uint)(auVar43._12_4_ == iVar42);
            auVar36._0_4_ = auVar36._4_4_;
            auVar36._8_4_ = auVar36._12_4_;
            auVar119 = pshuflw(in_XMM13,auVar36,0xe8);
            auVar44._0_4_ = auVar44._4_4_;
            auVar44._8_4_ = auVar44._12_4_;
            auVar43 = pshuflw(auVar118,auVar44,0xe8);
            auVar120._8_4_ = 0xffffffff;
            auVar120._0_8_ = 0xffffffffffffffff;
            auVar120._12_4_ = 0xffffffff;
            auVar43 = (auVar43 | auVar119 & auVar118) ^ auVar120;
            auVar43 = packssdw(auVar43,auVar43);
            if ((auVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7) = uVar1;
            }
            auVar44 = auVar36 & auVar79 | auVar44;
            auVar36 = packssdw(auVar44,auVar44);
            auVar36 = packssdw(auVar36 ^ auVar120,auVar36 ^ auVar120);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._0_4_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 1) = uVar1;
            }
            auVar36 = auVar123 ^ auVar132;
            iVar105 = -(uint)(iVar103 < auVar36._0_4_);
            auVar119._4_4_ = -(uint)(iVar104 < auVar36._4_4_);
            iVar117 = -(uint)(iVar41 < auVar36._8_4_);
            auVar119._12_4_ = -(uint)(iVar42 < auVar36._12_4_);
            auVar43._4_4_ = iVar105;
            auVar43._0_4_ = iVar105;
            auVar43._8_4_ = iVar117;
            auVar43._12_4_ = iVar117;
            auVar118._4_4_ = -(uint)(auVar36._4_4_ == iVar104);
            auVar118._12_4_ = -(uint)(auVar36._12_4_ == iVar42);
            auVar118._0_4_ = auVar118._4_4_;
            auVar118._8_4_ = auVar118._12_4_;
            auVar119._0_4_ = auVar119._4_4_;
            auVar119._8_4_ = auVar119._12_4_;
            auVar36 = auVar118 & auVar43 | auVar119;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packssdw(auVar36 ^ auVar120,auVar36 ^ auVar120);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._0_4_ >> 0x10 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 2) = uVar1;
            }
            auVar43 = pshufhw(auVar43,auVar43,0x84);
            auVar79 = pshufhw(auVar118,auVar118,0x84);
            auVar44 = pshufhw(auVar43,auVar119,0x84);
            auVar43 = (auVar44 | auVar79 & auVar43) ^ auVar120;
            auVar43 = packssdw(auVar43,auVar43);
            auVar43 = packsswb(auVar43,auVar43);
            if ((auVar43._0_4_ >> 0x18 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 3) = uVar1;
            }
            auVar43 = auVar88 ^ auVar132;
            iVar105 = -(uint)(iVar103 < auVar43._0_4_);
            auVar46._4_4_ = -(uint)(iVar104 < auVar43._4_4_);
            iVar117 = -(uint)(iVar41 < auVar43._8_4_);
            auVar46._12_4_ = -(uint)(iVar42 < auVar43._12_4_);
            auVar80._4_4_ = iVar105;
            auVar80._0_4_ = iVar105;
            auVar80._8_4_ = iVar117;
            auVar80._12_4_ = iVar117;
            auVar36 = pshuflw(auVar36,auVar80,0xe8);
            auVar45._4_4_ = -(uint)(auVar43._4_4_ == iVar104);
            auVar45._12_4_ = -(uint)(auVar43._12_4_ == iVar42);
            auVar45._0_4_ = auVar45._4_4_;
            auVar45._8_4_ = auVar45._12_4_;
            auVar44 = pshuflw(auVar120,auVar45,0xe8);
            auVar46._0_4_ = auVar46._4_4_;
            auVar46._8_4_ = auVar46._12_4_;
            auVar43 = pshuflw(auVar36,auVar46,0xe8);
            auVar121._8_4_ = 0xffffffff;
            auVar121._0_8_ = 0xffffffffffffffff;
            auVar121._12_4_ = 0xffffffff;
            auVar36 = (auVar43 | auVar44 & auVar36) ^ auVar121;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 4) = uVar1;
            }
            auVar46 = auVar45 & auVar80 | auVar46;
            auVar36 = packssdw(auVar46,auVar46);
            auVar36 = packssdw(auVar36 ^ auVar121,auVar36 ^ auVar121);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._4_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 5) = uVar1;
            }
            auVar36 = auVar21 ^ auVar132;
            iVar105 = -(uint)(iVar103 < auVar36._0_4_);
            auVar106._4_4_ = -(uint)(iVar104 < auVar36._4_4_);
            iVar117 = -(uint)(iVar41 < auVar36._8_4_);
            auVar106._12_4_ = -(uint)(iVar42 < auVar36._12_4_);
            auVar47._4_4_ = iVar105;
            auVar47._0_4_ = iVar105;
            auVar47._8_4_ = iVar117;
            auVar47._12_4_ = iVar117;
            auVar81._4_4_ = -(uint)(auVar36._4_4_ == iVar104);
            auVar81._12_4_ = -(uint)(auVar36._12_4_ == iVar42);
            auVar81._0_4_ = auVar81._4_4_;
            auVar81._8_4_ = auVar81._12_4_;
            auVar106._0_4_ = auVar106._4_4_;
            auVar106._8_4_ = auVar106._12_4_;
            auVar36 = auVar81 & auVar47 | auVar106;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packssdw(auVar36 ^ auVar121,auVar36 ^ auVar121);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 6) = uVar1;
            }
            auVar43 = pshufhw(auVar47,auVar47,0x84);
            auVar79 = pshufhw(auVar81,auVar81,0x84);
            auVar44 = pshufhw(auVar43,auVar106,0x84);
            auVar43 = (auVar44 | auVar79 & auVar43) ^ auVar121;
            auVar43 = packssdw(auVar43,auVar43);
            auVar43 = packsswb(auVar43,auVar43);
            if ((auVar43._6_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 7) = uVar1;
            }
            auVar43 = auVar24 ^ auVar132;
            iVar105 = -(uint)(iVar103 < auVar43._0_4_);
            auVar49._4_4_ = -(uint)(iVar104 < auVar43._4_4_);
            iVar117 = -(uint)(iVar41 < auVar43._8_4_);
            auVar49._12_4_ = -(uint)(iVar42 < auVar43._12_4_);
            auVar82._4_4_ = iVar105;
            auVar82._0_4_ = iVar105;
            auVar82._8_4_ = iVar117;
            auVar82._12_4_ = iVar117;
            auVar36 = pshuflw(auVar36,auVar82,0xe8);
            auVar48._4_4_ = -(uint)(auVar43._4_4_ == iVar104);
            auVar48._12_4_ = -(uint)(auVar43._12_4_ == iVar42);
            auVar48._0_4_ = auVar48._4_4_;
            auVar48._8_4_ = auVar48._12_4_;
            auVar44 = pshuflw(auVar121,auVar48,0xe8);
            auVar49._0_4_ = auVar49._4_4_;
            auVar49._8_4_ = auVar49._12_4_;
            auVar43 = pshuflw(auVar36,auVar49,0xe8);
            auVar122._8_4_ = 0xffffffff;
            auVar122._0_8_ = 0xffffffffffffffff;
            auVar122._12_4_ = 0xffffffff;
            auVar36 = (auVar43 | auVar44 & auVar36) ^ auVar122;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 8) = uVar1;
            }
            auVar49 = auVar48 & auVar82 | auVar49;
            auVar36 = packssdw(auVar49,auVar49);
            auVar36 = packssdw(auVar36 ^ auVar122,auVar36 ^ auVar122);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._8_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 9) = uVar1;
            }
            auVar36 = auVar27 ^ auVar132;
            iVar105 = -(uint)(iVar103 < auVar36._0_4_);
            auVar107._4_4_ = -(uint)(iVar104 < auVar36._4_4_);
            iVar117 = -(uint)(iVar41 < auVar36._8_4_);
            auVar107._12_4_ = -(uint)(iVar42 < auVar36._12_4_);
            auVar50._4_4_ = iVar105;
            auVar50._0_4_ = iVar105;
            auVar50._8_4_ = iVar117;
            auVar50._12_4_ = iVar117;
            auVar83._4_4_ = -(uint)(auVar36._4_4_ == iVar104);
            auVar83._12_4_ = -(uint)(auVar36._12_4_ == iVar42);
            auVar83._0_4_ = auVar83._4_4_;
            auVar83._8_4_ = auVar83._12_4_;
            auVar107._0_4_ = auVar107._4_4_;
            auVar107._8_4_ = auVar107._12_4_;
            auVar36 = auVar83 & auVar50 | auVar107;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packssdw(auVar36 ^ auVar122,auVar36 ^ auVar122);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 10) = uVar1;
            }
            auVar43 = pshufhw(auVar50,auVar50,0x84);
            auVar79 = pshufhw(auVar83,auVar83,0x84);
            auVar44 = pshufhw(auVar43,auVar107,0x84);
            auVar43 = (auVar44 | auVar79 & auVar43) ^ auVar122;
            auVar43 = packssdw(auVar43,auVar43);
            auVar43 = packsswb(auVar43,auVar43);
            if ((auVar43._10_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 0xb) = uVar1;
            }
            auVar43 = auVar30 ^ auVar132;
            iVar105 = -(uint)(iVar103 < auVar43._0_4_);
            auVar52._4_4_ = -(uint)(iVar104 < auVar43._4_4_);
            iVar117 = -(uint)(iVar41 < auVar43._8_4_);
            auVar52._12_4_ = -(uint)(iVar42 < auVar43._12_4_);
            auVar84._4_4_ = iVar105;
            auVar84._0_4_ = iVar105;
            auVar84._8_4_ = iVar117;
            auVar84._12_4_ = iVar117;
            auVar36 = pshuflw(auVar36,auVar84,0xe8);
            auVar51._4_4_ = -(uint)(auVar43._4_4_ == iVar104);
            auVar51._12_4_ = -(uint)(auVar43._12_4_ == iVar42);
            auVar51._0_4_ = auVar51._4_4_;
            auVar51._8_4_ = auVar51._12_4_;
            auVar44 = pshuflw(auVar122,auVar51,0xe8);
            auVar52._0_4_ = auVar52._4_4_;
            auVar52._8_4_ = auVar52._12_4_;
            auVar43 = pshuflw(auVar36,auVar52,0xe8);
            in_XMM13._8_4_ = 0xffffffff;
            in_XMM13._0_8_ = 0xffffffffffffffff;
            in_XMM13._12_4_ = 0xffffffff;
            auVar36 = (auVar43 | auVar44 & auVar36) ^ in_XMM13;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 0xc) = uVar1;
            }
            auVar52 = auVar51 & auVar84 | auVar52;
            auVar36 = packssdw(auVar52,auVar52);
            auVar36 = packssdw(auVar36 ^ in_XMM13,auVar36 ^ in_XMM13);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._12_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 0xd) = uVar1;
            }
            auVar36 = auVar33 ^ auVar132;
            auVar108._0_4_ = -(uint)(iVar103 < auVar36._0_4_);
            auVar108._4_4_ = -(uint)(iVar104 < auVar36._4_4_);
            auVar108._8_4_ = -(uint)(iVar41 < auVar36._8_4_);
            auVar108._12_4_ = -(uint)(iVar42 < auVar36._12_4_);
            auVar53._4_4_ = auVar108._0_4_;
            auVar53._0_4_ = auVar108._0_4_;
            auVar53._8_4_ = auVar108._8_4_;
            auVar53._12_4_ = auVar108._8_4_;
            iVar103 = -(uint)(auVar36._4_4_ == iVar104);
            iVar104 = -(uint)(auVar36._12_4_ == iVar42);
            auVar37._4_4_ = iVar103;
            auVar37._0_4_ = iVar103;
            auVar37._8_4_ = iVar104;
            auVar37._12_4_ = iVar104;
            auVar85._4_4_ = auVar108._4_4_;
            auVar85._0_4_ = auVar108._4_4_;
            auVar85._8_4_ = auVar108._12_4_;
            auVar85._12_4_ = auVar108._12_4_;
            in_XMM12 = auVar37 & auVar53 | auVar85;
            auVar36 = packssdw(auVar108,in_XMM12);
            auVar36 = packssdw(auVar36 ^ in_XMM13,auVar36 ^ in_XMM13);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 0xe) = uVar1;
            }
            auVar43 = pshufhw(auVar53,auVar53,0x84);
            auVar36 = pshufhw(auVar37,auVar37,0x84);
            auVar44 = pshufhw(auVar43,auVar85,0x84);
            auVar36 = packssdw(auVar36 & auVar43,(auVar44 | auVar36 & auVar43) ^ in_XMM13);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._14_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 0xf) = uVar1;
            }
            uVar7 = uVar7 + 0x10;
            lVar4 = auVar54._8_8_;
            auVar54._0_8_ = auVar54._0_8_ + 0x10;
            auVar54._8_8_ = lVar4 + 0x10;
            lVar4 = auVar123._8_8_;
            auVar123._0_8_ = auVar123._0_8_ + 0x10;
            auVar123._8_8_ = lVar4 + 0x10;
            lVar4 = auVar88._8_8_;
            auVar88._0_8_ = auVar88._0_8_ + 0x10;
            auVar88._8_8_ = lVar4 + 0x10;
            lVar4 = auVar21._8_8_;
            auVar21._0_8_ = auVar21._0_8_ + 0x10;
            auVar21._8_8_ = lVar4 + 0x10;
            lVar4 = auVar24._8_8_;
            auVar24._0_8_ = auVar24._0_8_ + 0x10;
            auVar24._8_8_ = lVar4 + 0x10;
            lVar4 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + 0x10;
            auVar27._8_8_ = lVar4 + 0x10;
            lVar4 = auVar30._8_8_;
            auVar30._0_8_ = auVar30._0_8_ + 0x10;
            auVar30._8_8_ = lVar4 + 0x10;
            lVar4 = auVar33._8_8_;
            auVar33._0_8_ = auVar33._0_8_ + 0x10;
            auVar33._8_8_ = lVar4 + 0x10;
            uVar8 = __n;
          } while ((left + 0xfU & 0xfffffff0) != uVar7);
        }
        iVar103 = src->w;
        if ((long)iVar103 < 0xc) {
          if ((int)uVar8 < iVar103 + left) {
            do {
              *(undefined1 *)((long)__s + uVar8) = puVar11[uVar8 - lVar6];
              uVar8 = uVar8 + 1;
            } while ((long)uVar8 < src->w + lVar6);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar6),puVar11,(long)iVar103);
          uVar8 = (ulong)(uint)((int)uVar8 + src->w);
          auVar132 = _DAT_00172100;
        }
        if ((int)uVar8 < (int)uVar2) {
          lVar4 = (long)(int)uVar8;
          do {
            *(undefined1 *)((long)__s + lVar4) = puVar11[(long)src->w + -1];
            lVar4 = lVar4 + 1;
          } while (lVar10 != lVar4);
        }
        __s = (void *)((long)__s + lVar10);
        iVar12 = iVar12 + 1;
        iVar103 = top;
      } while (iVar12 != top);
    }
    if (iVar103 < src->h + top) {
      lVar4 = __n - 1;
      auVar130._8_4_ = (int)lVar4;
      auVar130._0_8_ = lVar4;
      auVar130._12_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar132 = _DAT_00172100;
      do {
        uVar8 = 0;
        if (0 < left) {
          uVar1 = *puVar11;
          uVar7 = 0;
          auVar15 = _DAT_00172270;
          auVar17 = _DAT_00172260;
          auVar19 = _DAT_001727b0;
          auVar22 = _DAT_001727a0;
          auVar25 = _DAT_00172790;
          auVar28 = _DAT_00172780;
          auVar31 = _DAT_00172770;
          auVar34 = _DAT_00172760;
          do {
            auVar38 = auVar130 ^ auVar132;
            auVar54 = auVar15 ^ auVar132;
            iVar12 = auVar38._0_4_;
            iVar105 = -(uint)(iVar12 < auVar54._0_4_);
            iVar104 = auVar38._4_4_;
            auVar56._4_4_ = -(uint)(iVar104 < auVar54._4_4_);
            iVar41 = auVar38._8_4_;
            iVar117 = -(uint)(iVar41 < auVar54._8_4_);
            iVar42 = auVar38._12_4_;
            auVar56._12_4_ = -(uint)(iVar42 < auVar54._12_4_);
            auVar86._4_4_ = iVar105;
            auVar86._0_4_ = iVar105;
            auVar86._8_4_ = iVar117;
            auVar86._12_4_ = iVar117;
            auVar38 = pshuflw(in_XMM12,auVar86,0xe8);
            auVar55._4_4_ = -(uint)(auVar54._4_4_ == iVar104);
            auVar55._12_4_ = -(uint)(auVar54._12_4_ == iVar42);
            auVar55._0_4_ = auVar55._4_4_;
            auVar55._8_4_ = auVar55._12_4_;
            auVar123 = pshuflw(in_XMM13,auVar55,0xe8);
            auVar56._0_4_ = auVar56._4_4_;
            auVar56._8_4_ = auVar56._12_4_;
            auVar54 = pshuflw(auVar38,auVar56,0xe8);
            auVar124._8_4_ = 0xffffffff;
            auVar124._0_8_ = 0xffffffffffffffff;
            auVar124._12_4_ = 0xffffffff;
            auVar38 = (auVar54 | auVar123 & auVar38) ^ auVar124;
            auVar38 = packssdw(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7) = uVar1;
            }
            auVar56 = auVar55 & auVar86 | auVar56;
            auVar38 = packssdw(auVar56,auVar56);
            auVar38 = packssdw(auVar38 ^ auVar124,auVar38 ^ auVar124);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._0_4_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 1) = uVar1;
            }
            auVar38 = auVar17 ^ auVar132;
            iVar105 = -(uint)(iVar12 < auVar38._0_4_);
            auVar109._4_4_ = -(uint)(iVar104 < auVar38._4_4_);
            iVar117 = -(uint)(iVar41 < auVar38._8_4_);
            auVar109._12_4_ = -(uint)(iVar42 < auVar38._12_4_);
            auVar57._4_4_ = iVar105;
            auVar57._0_4_ = iVar105;
            auVar57._8_4_ = iVar117;
            auVar57._12_4_ = iVar117;
            auVar87._4_4_ = -(uint)(auVar38._4_4_ == iVar104);
            auVar87._12_4_ = -(uint)(auVar38._12_4_ == iVar42);
            auVar87._0_4_ = auVar87._4_4_;
            auVar87._8_4_ = auVar87._12_4_;
            auVar109._0_4_ = auVar109._4_4_;
            auVar109._8_4_ = auVar109._12_4_;
            auVar38 = auVar87 & auVar57 | auVar109;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packssdw(auVar38 ^ auVar124,auVar38 ^ auVar124);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._0_4_ >> 0x10 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 2) = uVar1;
            }
            auVar54 = pshufhw(auVar57,auVar57,0x84);
            auVar88 = pshufhw(auVar87,auVar87,0x84);
            auVar123 = pshufhw(auVar54,auVar109,0x84);
            auVar54 = (auVar123 | auVar88 & auVar54) ^ auVar124;
            auVar54 = packssdw(auVar54,auVar54);
            auVar54 = packsswb(auVar54,auVar54);
            if ((auVar54._0_4_ >> 0x18 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 3) = uVar1;
            }
            auVar54 = auVar19 ^ auVar132;
            iVar105 = -(uint)(iVar12 < auVar54._0_4_);
            auVar59._4_4_ = -(uint)(iVar104 < auVar54._4_4_);
            iVar117 = -(uint)(iVar41 < auVar54._8_4_);
            auVar59._12_4_ = -(uint)(iVar42 < auVar54._12_4_);
            auVar89._4_4_ = iVar105;
            auVar89._0_4_ = iVar105;
            auVar89._8_4_ = iVar117;
            auVar89._12_4_ = iVar117;
            auVar38 = pshuflw(auVar38,auVar89,0xe8);
            auVar58._4_4_ = -(uint)(auVar54._4_4_ == iVar104);
            auVar58._12_4_ = -(uint)(auVar54._12_4_ == iVar42);
            auVar58._0_4_ = auVar58._4_4_;
            auVar58._8_4_ = auVar58._12_4_;
            auVar123 = pshuflw(auVar124,auVar58,0xe8);
            auVar59._0_4_ = auVar59._4_4_;
            auVar59._8_4_ = auVar59._12_4_;
            auVar54 = pshuflw(auVar38,auVar59,0xe8);
            auVar125._8_4_ = 0xffffffff;
            auVar125._0_8_ = 0xffffffffffffffff;
            auVar125._12_4_ = 0xffffffff;
            auVar38 = (auVar54 | auVar123 & auVar38) ^ auVar125;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 4) = uVar1;
            }
            auVar59 = auVar58 & auVar89 | auVar59;
            auVar38 = packssdw(auVar59,auVar59);
            auVar38 = packssdw(auVar38 ^ auVar125,auVar38 ^ auVar125);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._4_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 5) = uVar1;
            }
            auVar38 = auVar22 ^ auVar132;
            iVar105 = -(uint)(iVar12 < auVar38._0_4_);
            auVar110._4_4_ = -(uint)(iVar104 < auVar38._4_4_);
            iVar117 = -(uint)(iVar41 < auVar38._8_4_);
            auVar110._12_4_ = -(uint)(iVar42 < auVar38._12_4_);
            auVar60._4_4_ = iVar105;
            auVar60._0_4_ = iVar105;
            auVar60._8_4_ = iVar117;
            auVar60._12_4_ = iVar117;
            auVar90._4_4_ = -(uint)(auVar38._4_4_ == iVar104);
            auVar90._12_4_ = -(uint)(auVar38._12_4_ == iVar42);
            auVar90._0_4_ = auVar90._4_4_;
            auVar90._8_4_ = auVar90._12_4_;
            auVar110._0_4_ = auVar110._4_4_;
            auVar110._8_4_ = auVar110._12_4_;
            auVar38 = auVar90 & auVar60 | auVar110;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packssdw(auVar38 ^ auVar125,auVar38 ^ auVar125);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 6) = uVar1;
            }
            auVar54 = pshufhw(auVar60,auVar60,0x84);
            auVar88 = pshufhw(auVar90,auVar90,0x84);
            auVar123 = pshufhw(auVar54,auVar110,0x84);
            auVar54 = (auVar123 | auVar88 & auVar54) ^ auVar125;
            auVar54 = packssdw(auVar54,auVar54);
            auVar54 = packsswb(auVar54,auVar54);
            if ((auVar54._6_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 7) = uVar1;
            }
            auVar54 = auVar25 ^ auVar132;
            iVar105 = -(uint)(iVar12 < auVar54._0_4_);
            auVar62._4_4_ = -(uint)(iVar104 < auVar54._4_4_);
            iVar117 = -(uint)(iVar41 < auVar54._8_4_);
            auVar62._12_4_ = -(uint)(iVar42 < auVar54._12_4_);
            auVar91._4_4_ = iVar105;
            auVar91._0_4_ = iVar105;
            auVar91._8_4_ = iVar117;
            auVar91._12_4_ = iVar117;
            auVar38 = pshuflw(auVar38,auVar91,0xe8);
            auVar61._4_4_ = -(uint)(auVar54._4_4_ == iVar104);
            auVar61._12_4_ = -(uint)(auVar54._12_4_ == iVar42);
            auVar61._0_4_ = auVar61._4_4_;
            auVar61._8_4_ = auVar61._12_4_;
            auVar123 = pshuflw(auVar125,auVar61,0xe8);
            auVar62._0_4_ = auVar62._4_4_;
            auVar62._8_4_ = auVar62._12_4_;
            auVar54 = pshuflw(auVar38,auVar62,0xe8);
            auVar126._8_4_ = 0xffffffff;
            auVar126._0_8_ = 0xffffffffffffffff;
            auVar126._12_4_ = 0xffffffff;
            auVar38 = (auVar54 | auVar123 & auVar38) ^ auVar126;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 8) = uVar1;
            }
            auVar62 = auVar61 & auVar91 | auVar62;
            auVar38 = packssdw(auVar62,auVar62);
            auVar38 = packssdw(auVar38 ^ auVar126,auVar38 ^ auVar126);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._8_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 9) = uVar1;
            }
            auVar38 = auVar28 ^ auVar132;
            iVar105 = -(uint)(iVar12 < auVar38._0_4_);
            auVar111._4_4_ = -(uint)(iVar104 < auVar38._4_4_);
            iVar117 = -(uint)(iVar41 < auVar38._8_4_);
            auVar111._12_4_ = -(uint)(iVar42 < auVar38._12_4_);
            auVar63._4_4_ = iVar105;
            auVar63._0_4_ = iVar105;
            auVar63._8_4_ = iVar117;
            auVar63._12_4_ = iVar117;
            auVar92._4_4_ = -(uint)(auVar38._4_4_ == iVar104);
            auVar92._12_4_ = -(uint)(auVar38._12_4_ == iVar42);
            auVar92._0_4_ = auVar92._4_4_;
            auVar92._8_4_ = auVar92._12_4_;
            auVar111._0_4_ = auVar111._4_4_;
            auVar111._8_4_ = auVar111._12_4_;
            auVar38 = auVar92 & auVar63 | auVar111;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packssdw(auVar38 ^ auVar126,auVar38 ^ auVar126);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 10) = uVar1;
            }
            auVar54 = pshufhw(auVar63,auVar63,0x84);
            auVar88 = pshufhw(auVar92,auVar92,0x84);
            auVar123 = pshufhw(auVar54,auVar111,0x84);
            auVar54 = (auVar123 | auVar88 & auVar54) ^ auVar126;
            auVar54 = packssdw(auVar54,auVar54);
            auVar54 = packsswb(auVar54,auVar54);
            if ((auVar54._10_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 0xb) = uVar1;
            }
            auVar54 = auVar31 ^ auVar132;
            iVar105 = -(uint)(iVar12 < auVar54._0_4_);
            auVar65._4_4_ = -(uint)(iVar104 < auVar54._4_4_);
            iVar117 = -(uint)(iVar41 < auVar54._8_4_);
            auVar65._12_4_ = -(uint)(iVar42 < auVar54._12_4_);
            auVar93._4_4_ = iVar105;
            auVar93._0_4_ = iVar105;
            auVar93._8_4_ = iVar117;
            auVar93._12_4_ = iVar117;
            auVar38 = pshuflw(auVar38,auVar93,0xe8);
            auVar64._4_4_ = -(uint)(auVar54._4_4_ == iVar104);
            auVar64._12_4_ = -(uint)(auVar54._12_4_ == iVar42);
            auVar64._0_4_ = auVar64._4_4_;
            auVar64._8_4_ = auVar64._12_4_;
            auVar123 = pshuflw(auVar126,auVar64,0xe8);
            auVar65._0_4_ = auVar65._4_4_;
            auVar65._8_4_ = auVar65._12_4_;
            auVar54 = pshuflw(auVar38,auVar65,0xe8);
            in_XMM13._8_4_ = 0xffffffff;
            in_XMM13._0_8_ = 0xffffffffffffffff;
            in_XMM13._12_4_ = 0xffffffff;
            auVar38 = (auVar54 | auVar123 & auVar38) ^ in_XMM13;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 0xc) = uVar1;
            }
            auVar65 = auVar64 & auVar93 | auVar65;
            auVar38 = packssdw(auVar65,auVar65);
            auVar38 = packssdw(auVar38 ^ in_XMM13,auVar38 ^ in_XMM13);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._12_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 0xd) = uVar1;
            }
            auVar38 = auVar34 ^ auVar132;
            auVar112._0_4_ = -(uint)(iVar12 < auVar38._0_4_);
            auVar112._4_4_ = -(uint)(iVar104 < auVar38._4_4_);
            auVar112._8_4_ = -(uint)(iVar41 < auVar38._8_4_);
            auVar112._12_4_ = -(uint)(iVar42 < auVar38._12_4_);
            auVar66._4_4_ = auVar112._0_4_;
            auVar66._0_4_ = auVar112._0_4_;
            auVar66._8_4_ = auVar112._8_4_;
            auVar66._12_4_ = auVar112._8_4_;
            iVar12 = -(uint)(auVar38._4_4_ == iVar104);
            iVar104 = -(uint)(auVar38._12_4_ == iVar42);
            auVar39._4_4_ = iVar12;
            auVar39._0_4_ = iVar12;
            auVar39._8_4_ = iVar104;
            auVar39._12_4_ = iVar104;
            auVar94._4_4_ = auVar112._4_4_;
            auVar94._0_4_ = auVar112._4_4_;
            auVar94._8_4_ = auVar112._12_4_;
            auVar94._12_4_ = auVar112._12_4_;
            in_XMM12 = auVar39 & auVar66 | auVar94;
            auVar38 = packssdw(auVar112,in_XMM12);
            auVar38 = packssdw(auVar38 ^ in_XMM13,auVar38 ^ in_XMM13);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 0xe) = uVar1;
            }
            auVar54 = pshufhw(auVar66,auVar66,0x84);
            auVar38 = pshufhw(auVar39,auVar39,0x84);
            auVar123 = pshufhw(auVar54,auVar94,0x84);
            auVar38 = packssdw(auVar38 & auVar54,(auVar123 | auVar38 & auVar54) ^ in_XMM13);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._14_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 0xf) = uVar1;
            }
            uVar7 = uVar7 + 0x10;
            lVar4 = auVar15._8_8_;
            auVar15._0_8_ = auVar15._0_8_ + 0x10;
            auVar15._8_8_ = lVar4 + 0x10;
            lVar4 = auVar17._8_8_;
            auVar17._0_8_ = auVar17._0_8_ + 0x10;
            auVar17._8_8_ = lVar4 + 0x10;
            lVar4 = auVar19._8_8_;
            auVar19._0_8_ = auVar19._0_8_ + 0x10;
            auVar19._8_8_ = lVar4 + 0x10;
            lVar4 = auVar22._8_8_;
            auVar22._0_8_ = auVar22._0_8_ + 0x10;
            auVar22._8_8_ = lVar4 + 0x10;
            lVar4 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 0x10;
            auVar25._8_8_ = lVar4 + 0x10;
            lVar4 = auVar28._8_8_;
            auVar28._0_8_ = auVar28._0_8_ + 0x10;
            auVar28._8_8_ = lVar4 + 0x10;
            lVar4 = auVar31._8_8_;
            auVar31._0_8_ = auVar31._0_8_ + 0x10;
            auVar31._8_8_ = lVar4 + 0x10;
            lVar4 = auVar34._8_8_;
            auVar34._0_8_ = auVar34._0_8_ + 0x10;
            auVar34._8_8_ = lVar4 + 0x10;
            uVar8 = __n;
          } while ((left + 0xfU & 0xfffffff0) != uVar7);
        }
        iVar12 = src->w;
        if ((long)iVar12 < 0xc) {
          if ((int)uVar8 < iVar12 + left) {
            do {
              *(undefined1 *)((long)__s + uVar8) = puVar11[uVar8 - lVar6];
              uVar8 = uVar8 + 1;
              iVar12 = src->w;
            } while ((long)uVar8 < (long)(iVar12 + left));
          }
        }
        else {
          memcpy((void *)((long)__s + lVar6),puVar11,(long)iVar12);
          iVar12 = src->w;
          uVar8 = (ulong)(uint)((int)uVar8 + iVar12);
          auVar132 = _DAT_00172100;
        }
        if ((int)uVar8 < (int)uVar2) {
          lVar4 = (long)(int)uVar8;
          do {
            *(undefined1 *)((long)__s + lVar4) = puVar11[(long)src->w + -1];
            lVar4 = lVar4 + 1;
          } while (lVar10 != lVar4);
          iVar12 = src->w;
        }
        lVar4 = (long)iVar12;
        puVar11 = puVar11 + lVar4;
        __s = (void *)((long)__s + lVar10);
        iVar103 = iVar103 + 1;
      } while (iVar103 < src->h + top);
    }
    else {
      lVar4 = (long)src->w;
    }
    if (iVar103 < iVar3) {
      puVar9 = puVar11 + -lVar4;
      lVar5 = __n - 1;
      auVar131._8_4_ = (int)lVar5;
      auVar131._0_8_ = lVar5;
      auVar131._12_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar132 = _DAT_00172100;
      do {
        uVar8 = 0;
        if (0 < left) {
          uVar1 = *puVar9;
          uVar7 = 0;
          auVar16 = _DAT_00172270;
          auVar18 = _DAT_00172260;
          auVar20 = _DAT_001727b0;
          auVar23 = _DAT_001727a0;
          auVar26 = _DAT_00172790;
          auVar29 = _DAT_00172780;
          auVar32 = _DAT_00172770;
          auVar35 = _DAT_00172760;
          do {
            auVar38 = auVar131 ^ auVar132;
            auVar54 = auVar16 ^ auVar132;
            iVar12 = auVar38._0_4_;
            iVar105 = -(uint)(iVar12 < auVar54._0_4_);
            iVar104 = auVar38._4_4_;
            auVar68._4_4_ = -(uint)(iVar104 < auVar54._4_4_);
            iVar41 = auVar38._8_4_;
            iVar117 = -(uint)(iVar41 < auVar54._8_4_);
            iVar42 = auVar38._12_4_;
            auVar68._12_4_ = -(uint)(iVar42 < auVar54._12_4_);
            auVar95._4_4_ = iVar105;
            auVar95._0_4_ = iVar105;
            auVar95._8_4_ = iVar117;
            auVar95._12_4_ = iVar117;
            auVar38 = pshuflw(in_XMM12,auVar95,0xe8);
            auVar67._4_4_ = -(uint)(auVar54._4_4_ == iVar104);
            auVar67._12_4_ = -(uint)(auVar54._12_4_ == iVar42);
            auVar67._0_4_ = auVar67._4_4_;
            auVar67._8_4_ = auVar67._12_4_;
            auVar123 = pshuflw(in_XMM13,auVar67,0xe8);
            auVar68._0_4_ = auVar68._4_4_;
            auVar68._8_4_ = auVar68._12_4_;
            auVar54 = pshuflw(auVar38,auVar68,0xe8);
            auVar127._8_4_ = 0xffffffff;
            auVar127._0_8_ = 0xffffffffffffffff;
            auVar127._12_4_ = 0xffffffff;
            auVar38 = (auVar54 | auVar123 & auVar38) ^ auVar127;
            auVar38 = packssdw(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7) = uVar1;
            }
            auVar68 = auVar67 & auVar95 | auVar68;
            auVar38 = packssdw(auVar68,auVar68);
            auVar38 = packssdw(auVar38 ^ auVar127,auVar38 ^ auVar127);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._0_4_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 1) = uVar1;
            }
            auVar38 = auVar18 ^ auVar132;
            iVar105 = -(uint)(iVar12 < auVar38._0_4_);
            auVar113._4_4_ = -(uint)(iVar104 < auVar38._4_4_);
            iVar117 = -(uint)(iVar41 < auVar38._8_4_);
            auVar113._12_4_ = -(uint)(iVar42 < auVar38._12_4_);
            auVar69._4_4_ = iVar105;
            auVar69._0_4_ = iVar105;
            auVar69._8_4_ = iVar117;
            auVar69._12_4_ = iVar117;
            auVar96._4_4_ = -(uint)(auVar38._4_4_ == iVar104);
            auVar96._12_4_ = -(uint)(auVar38._12_4_ == iVar42);
            auVar96._0_4_ = auVar96._4_4_;
            auVar96._8_4_ = auVar96._12_4_;
            auVar113._0_4_ = auVar113._4_4_;
            auVar113._8_4_ = auVar113._12_4_;
            auVar38 = auVar96 & auVar69 | auVar113;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packssdw(auVar38 ^ auVar127,auVar38 ^ auVar127);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._0_4_ >> 0x10 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 2) = uVar1;
            }
            auVar54 = pshufhw(auVar69,auVar69,0x84);
            auVar88 = pshufhw(auVar96,auVar96,0x84);
            auVar123 = pshufhw(auVar54,auVar113,0x84);
            auVar54 = (auVar123 | auVar88 & auVar54) ^ auVar127;
            auVar54 = packssdw(auVar54,auVar54);
            auVar54 = packsswb(auVar54,auVar54);
            if ((auVar54._0_4_ >> 0x18 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 3) = uVar1;
            }
            auVar54 = auVar20 ^ auVar132;
            iVar105 = -(uint)(iVar12 < auVar54._0_4_);
            auVar71._4_4_ = -(uint)(iVar104 < auVar54._4_4_);
            iVar117 = -(uint)(iVar41 < auVar54._8_4_);
            auVar71._12_4_ = -(uint)(iVar42 < auVar54._12_4_);
            auVar97._4_4_ = iVar105;
            auVar97._0_4_ = iVar105;
            auVar97._8_4_ = iVar117;
            auVar97._12_4_ = iVar117;
            auVar38 = pshuflw(auVar38,auVar97,0xe8);
            auVar70._4_4_ = -(uint)(auVar54._4_4_ == iVar104);
            auVar70._12_4_ = -(uint)(auVar54._12_4_ == iVar42);
            auVar70._0_4_ = auVar70._4_4_;
            auVar70._8_4_ = auVar70._12_4_;
            auVar123 = pshuflw(auVar127,auVar70,0xe8);
            auVar71._0_4_ = auVar71._4_4_;
            auVar71._8_4_ = auVar71._12_4_;
            auVar54 = pshuflw(auVar38,auVar71,0xe8);
            auVar128._8_4_ = 0xffffffff;
            auVar128._0_8_ = 0xffffffffffffffff;
            auVar128._12_4_ = 0xffffffff;
            auVar38 = (auVar54 | auVar123 & auVar38) ^ auVar128;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 4) = uVar1;
            }
            auVar71 = auVar70 & auVar97 | auVar71;
            auVar38 = packssdw(auVar71,auVar71);
            auVar38 = packssdw(auVar38 ^ auVar128,auVar38 ^ auVar128);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._4_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 5) = uVar1;
            }
            auVar38 = auVar23 ^ auVar132;
            iVar105 = -(uint)(iVar12 < auVar38._0_4_);
            auVar114._4_4_ = -(uint)(iVar104 < auVar38._4_4_);
            iVar117 = -(uint)(iVar41 < auVar38._8_4_);
            auVar114._12_4_ = -(uint)(iVar42 < auVar38._12_4_);
            auVar72._4_4_ = iVar105;
            auVar72._0_4_ = iVar105;
            auVar72._8_4_ = iVar117;
            auVar72._12_4_ = iVar117;
            auVar98._4_4_ = -(uint)(auVar38._4_4_ == iVar104);
            auVar98._12_4_ = -(uint)(auVar38._12_4_ == iVar42);
            auVar98._0_4_ = auVar98._4_4_;
            auVar98._8_4_ = auVar98._12_4_;
            auVar114._0_4_ = auVar114._4_4_;
            auVar114._8_4_ = auVar114._12_4_;
            auVar38 = auVar98 & auVar72 | auVar114;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packssdw(auVar38 ^ auVar128,auVar38 ^ auVar128);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 6) = uVar1;
            }
            auVar54 = pshufhw(auVar72,auVar72,0x84);
            auVar88 = pshufhw(auVar98,auVar98,0x84);
            auVar123 = pshufhw(auVar54,auVar114,0x84);
            auVar54 = (auVar123 | auVar88 & auVar54) ^ auVar128;
            auVar54 = packssdw(auVar54,auVar54);
            auVar54 = packsswb(auVar54,auVar54);
            if ((auVar54._6_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 7) = uVar1;
            }
            auVar54 = auVar26 ^ auVar132;
            iVar105 = -(uint)(iVar12 < auVar54._0_4_);
            auVar74._4_4_ = -(uint)(iVar104 < auVar54._4_4_);
            iVar117 = -(uint)(iVar41 < auVar54._8_4_);
            auVar74._12_4_ = -(uint)(iVar42 < auVar54._12_4_);
            auVar99._4_4_ = iVar105;
            auVar99._0_4_ = iVar105;
            auVar99._8_4_ = iVar117;
            auVar99._12_4_ = iVar117;
            auVar38 = pshuflw(auVar38,auVar99,0xe8);
            auVar73._4_4_ = -(uint)(auVar54._4_4_ == iVar104);
            auVar73._12_4_ = -(uint)(auVar54._12_4_ == iVar42);
            auVar73._0_4_ = auVar73._4_4_;
            auVar73._8_4_ = auVar73._12_4_;
            auVar123 = pshuflw(auVar128,auVar73,0xe8);
            auVar74._0_4_ = auVar74._4_4_;
            auVar74._8_4_ = auVar74._12_4_;
            auVar54 = pshuflw(auVar38,auVar74,0xe8);
            auVar129._8_4_ = 0xffffffff;
            auVar129._0_8_ = 0xffffffffffffffff;
            auVar129._12_4_ = 0xffffffff;
            auVar38 = (auVar54 | auVar123 & auVar38) ^ auVar129;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 8) = uVar1;
            }
            auVar74 = auVar73 & auVar99 | auVar74;
            auVar38 = packssdw(auVar74,auVar74);
            auVar38 = packssdw(auVar38 ^ auVar129,auVar38 ^ auVar129);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._8_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 9) = uVar1;
            }
            auVar38 = auVar29 ^ auVar132;
            iVar105 = -(uint)(iVar12 < auVar38._0_4_);
            auVar115._4_4_ = -(uint)(iVar104 < auVar38._4_4_);
            iVar117 = -(uint)(iVar41 < auVar38._8_4_);
            auVar115._12_4_ = -(uint)(iVar42 < auVar38._12_4_);
            auVar75._4_4_ = iVar105;
            auVar75._0_4_ = iVar105;
            auVar75._8_4_ = iVar117;
            auVar75._12_4_ = iVar117;
            auVar100._4_4_ = -(uint)(auVar38._4_4_ == iVar104);
            auVar100._12_4_ = -(uint)(auVar38._12_4_ == iVar42);
            auVar100._0_4_ = auVar100._4_4_;
            auVar100._8_4_ = auVar100._12_4_;
            auVar115._0_4_ = auVar115._4_4_;
            auVar115._8_4_ = auVar115._12_4_;
            auVar38 = auVar100 & auVar75 | auVar115;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packssdw(auVar38 ^ auVar129,auVar38 ^ auVar129);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 10) = uVar1;
            }
            auVar54 = pshufhw(auVar75,auVar75,0x84);
            auVar88 = pshufhw(auVar100,auVar100,0x84);
            auVar123 = pshufhw(auVar54,auVar115,0x84);
            auVar54 = (auVar123 | auVar88 & auVar54) ^ auVar129;
            auVar54 = packssdw(auVar54,auVar54);
            auVar54 = packsswb(auVar54,auVar54);
            if ((auVar54._10_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 0xb) = uVar1;
            }
            auVar54 = auVar32 ^ auVar132;
            iVar105 = -(uint)(iVar12 < auVar54._0_4_);
            auVar77._4_4_ = -(uint)(iVar104 < auVar54._4_4_);
            iVar117 = -(uint)(iVar41 < auVar54._8_4_);
            auVar77._12_4_ = -(uint)(iVar42 < auVar54._12_4_);
            auVar101._4_4_ = iVar105;
            auVar101._0_4_ = iVar105;
            auVar101._8_4_ = iVar117;
            auVar101._12_4_ = iVar117;
            auVar38 = pshuflw(auVar38,auVar101,0xe8);
            auVar76._4_4_ = -(uint)(auVar54._4_4_ == iVar104);
            auVar76._12_4_ = -(uint)(auVar54._12_4_ == iVar42);
            auVar76._0_4_ = auVar76._4_4_;
            auVar76._8_4_ = auVar76._12_4_;
            auVar123 = pshuflw(auVar129,auVar76,0xe8);
            auVar77._0_4_ = auVar77._4_4_;
            auVar77._8_4_ = auVar77._12_4_;
            auVar54 = pshuflw(auVar38,auVar77,0xe8);
            in_XMM13._8_4_ = 0xffffffff;
            in_XMM13._0_8_ = 0xffffffffffffffff;
            in_XMM13._12_4_ = 0xffffffff;
            auVar38 = (auVar54 | auVar123 & auVar38) ^ in_XMM13;
            auVar38 = packssdw(auVar38,auVar38);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 0xc) = uVar1;
            }
            auVar77 = auVar76 & auVar101 | auVar77;
            auVar38 = packssdw(auVar77,auVar77);
            auVar38 = packssdw(auVar38 ^ in_XMM13,auVar38 ^ in_XMM13);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._12_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 0xd) = uVar1;
            }
            auVar38 = auVar35 ^ auVar132;
            auVar116._0_4_ = -(uint)(iVar12 < auVar38._0_4_);
            auVar116._4_4_ = -(uint)(iVar104 < auVar38._4_4_);
            auVar116._8_4_ = -(uint)(iVar41 < auVar38._8_4_);
            auVar116._12_4_ = -(uint)(iVar42 < auVar38._12_4_);
            auVar78._4_4_ = auVar116._0_4_;
            auVar78._0_4_ = auVar116._0_4_;
            auVar78._8_4_ = auVar116._8_4_;
            auVar78._12_4_ = auVar116._8_4_;
            iVar12 = -(uint)(auVar38._4_4_ == iVar104);
            iVar104 = -(uint)(auVar38._12_4_ == iVar42);
            auVar40._4_4_ = iVar12;
            auVar40._0_4_ = iVar12;
            auVar40._8_4_ = iVar104;
            auVar40._12_4_ = iVar104;
            auVar102._4_4_ = auVar116._4_4_;
            auVar102._0_4_ = auVar116._4_4_;
            auVar102._8_4_ = auVar116._12_4_;
            auVar102._12_4_ = auVar116._12_4_;
            in_XMM12 = auVar40 & auVar78 | auVar102;
            auVar38 = packssdw(auVar116,in_XMM12);
            auVar38 = packssdw(auVar38 ^ in_XMM13,auVar38 ^ in_XMM13);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar7 + 0xe) = uVar1;
            }
            auVar54 = pshufhw(auVar78,auVar78,0x84);
            auVar38 = pshufhw(auVar40,auVar40,0x84);
            auVar123 = pshufhw(auVar54,auVar102,0x84);
            auVar38 = packssdw(auVar38 & auVar54,(auVar123 | auVar38 & auVar54) ^ in_XMM13);
            auVar38 = packsswb(auVar38,auVar38);
            if ((auVar38._14_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar7 + 0xf) = uVar1;
            }
            uVar7 = uVar7 + 0x10;
            lVar5 = auVar16._8_8_;
            auVar16._0_8_ = auVar16._0_8_ + 0x10;
            auVar16._8_8_ = lVar5 + 0x10;
            lVar5 = auVar18._8_8_;
            auVar18._0_8_ = auVar18._0_8_ + 0x10;
            auVar18._8_8_ = lVar5 + 0x10;
            lVar5 = auVar20._8_8_;
            auVar20._0_8_ = auVar20._0_8_ + 0x10;
            auVar20._8_8_ = lVar5 + 0x10;
            lVar5 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + 0x10;
            auVar23._8_8_ = lVar5 + 0x10;
            lVar5 = auVar26._8_8_;
            auVar26._0_8_ = auVar26._0_8_ + 0x10;
            auVar26._8_8_ = lVar5 + 0x10;
            lVar5 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 0x10;
            auVar29._8_8_ = lVar5 + 0x10;
            lVar5 = auVar32._8_8_;
            auVar32._0_8_ = auVar32._0_8_ + 0x10;
            auVar32._8_8_ = lVar5 + 0x10;
            lVar5 = auVar35._8_8_;
            auVar35._0_8_ = auVar35._0_8_ + 0x10;
            auVar35._8_8_ = lVar5 + 0x10;
            uVar8 = __n;
          } while ((left + 0xfU & 0xfffffff0) != uVar7);
        }
        iVar12 = src->w;
        if ((long)iVar12 < 0xc) {
          if ((int)uVar8 < iVar12 + left) {
            do {
              *(undefined1 *)((long)__s + uVar8) = puVar11[uVar8 + (-lVar6 - lVar4)];
              uVar8 = uVar8 + 1;
            } while ((long)uVar8 < src->w + lVar6);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar6),puVar9,(long)iVar12);
          uVar8 = (ulong)(uint)((int)uVar8 + src->w);
          auVar132 = _DAT_00172100;
        }
        if ((int)uVar8 < (int)uVar2) {
          lVar5 = (long)(int)uVar8;
          do {
            *(undefined1 *)((long)__s + lVar5) = puVar9[(long)src->w + -1];
            lVar5 = lVar5 + 1;
          } while (lVar10 != lVar5);
        }
        __s = (void *)((long)__s + lVar10);
        iVar103 = iVar103 + 1;
      } while (iVar103 != iVar3);
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }
    else if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }
    else if (type == 2)
    {
        int y = 0;
        // fill top
        ptr += top * src.w;
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= 2 * src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
    }

}